

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

matd_t * matd_select(matd_t *a,int r0,int r1,int c0,int c1)

{
  matd_t *pmVar1;
  int local_38;
  int local_34;
  int col;
  int row;
  matd_t *r;
  int ncols;
  int nrows;
  int c1_local;
  int c0_local;
  int r1_local;
  int r0_local;
  matd_t *a_local;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0xa8,"matd_t *matd_select(const matd_t *, int, int, int, int)");
  }
  if ((-1 < r0) && ((uint)r0 < a->nrows)) {
    if ((-1 < c0) && ((uint)c0 < a->ncols)) {
      pmVar1 = matd_create((r1 - r0) + 1,(c1 - c0) + 1);
      for (local_34 = r0; local_38 = c0, local_34 <= r1; local_34 = local_34 + 1) {
        for (; local_38 <= c1; local_38 = local_38 + 1) {
          pmVar1[(ulong)((local_34 - r0) * pmVar1->ncols + (local_38 - c0)) + 1] =
               a[(ulong)(local_34 * a->ncols + local_38) + 1];
        }
      }
      return pmVar1;
    }
    __assert_fail("c0 >= 0 && c0 < a->ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0xab,"matd_t *matd_select(const matd_t *, int, int, int, int)");
  }
  __assert_fail("r0 >= 0 && r0 < a->nrows",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0xaa,"matd_t *matd_select(const matd_t *, int, int, int, int)");
}

Assistant:

matd_t *matd_select(const matd_t * a, int r0, int r1, int c0, int c1)
{
    assert(a != NULL);

    assert(r0 >= 0 && r0 < a->nrows);
    assert(c0 >= 0 && c0 < a->ncols);

    int nrows = r1 - r0 + 1;
    int ncols = c1 - c0 + 1;

    matd_t * r = matd_create(nrows, ncols);

    for (int row = r0; row <= r1; row++)
        for (int col = c0; col <= c1; col++)
            MATD_EL(r,row-r0,col-c0) = MATD_EL(a,row,col);

    return r;
}